

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O1

bool __thiscall DOMTest::testLSExceptions(DOMTest *this)

{
  XMLCh XVar1;
  XMLCh XVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  undefined8 uVar8;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  ParserAborter aborter;
  
  plVar3 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
  plVar4 = (long *)(**(code **)(*plVar3 + 0x10))
                             (plVar3,1,0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x20))
                             (plVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("<?xml version=\'1.0\'?><!DOCTYPE root[<!ENTITY ent1 \'Dallas. &ent3; #5668\'><!ENTITY ent2 \'1900 Dallas Road<![CDATA[ (East) ]]>\'><!ENTITY ent3 \'California. &ent4; PO\'>  <!ENTITY ent4 \'USA \'><!ENTITY ent5 \'The Content &ent6; never reached\'><!ENTITY ent6 \'ends here. <foo/>\'>]><root>&ent1; &ent2;<elem>Home </elem><elem>Test: &ent5;</elem></root>"
             ,tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar3 + 0x40))(plVar3,tempStr);
  (**(code **)(*plVar4 + 0x30))(plVar4);
  (**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x138a);
  (**(code **)(*plVar4 + 0x30))(plVar4);
  (**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x139c);
  (**(code **)(*plVar4 + 0x30))(plVar4);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x10))(plVar4);
  (**(code **)(*plVar5 + 8))(plVar5,&xercesc_4_0::XMLUni::fgDOMEntities,0);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  if ((plVar5 != (long *)0x0) && (lVar6 = (**(code **)(*plVar5 + 0x68))(plVar5), lVar6 != 0)) {
    plVar5 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
    (**(code **)(*plVar5 + 0x200))(plVar5);
  }
  testLSExceptions();
  xercesc_4_0::XMLString::transcode
            ("<?xml version=\'1.0\'?><root xmlns:x=\'urn:yyy\'><elem xmlns:x=\'urn:xxx\'>Home</elem><elem2>Test</elem2><elem>Home</elem><elem2>Test</elem2></root>"
             ,tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar3 + 0x40))(plVar3,tempStr);
  (**(code **)(*plVar4 + 0x30))(plVar4);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  if ((plVar5 != (long *)0x0) && (lVar6 = (**(code **)(*plVar5 + 0x68))(plVar5), lVar6 != 0)) {
    plVar5 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
    (**(code **)(*plVar5 + 0x200))(plVar5);
  }
  testLSExceptions();
  pXVar10 = tempStr2;
  xercesc_4_0::XMLString::transcode
            ("root",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar4 + 0x30))(plVar4,0);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  plVar7 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  uVar8 = (**(code **)(*plVar7 + 0x1e0))(plVar7);
  (**(code **)(*plVar4 + 0x50))(plVar4,plVar3,uVar8,1);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
  pXVar9 = (XMLCh *)(**(code **)(*plVar5 + 0x10))(plVar5);
  if (pXVar9 != tempStr2) {
    if (pXVar9 == (XMLCh *)0x0) {
LAB_0011af54:
      if (*pXVar10 == L'\0') goto LAB_0011af5f;
    }
    else {
      pXVar10 = tempStr2;
      do {
        XVar1 = *pXVar9;
        if (XVar1 == L'\0') goto LAB_0011af54;
        pXVar9 = pXVar9 + 1;
        XVar2 = *pXVar10;
        pXVar10 = pXVar10 + 1;
      } while (XVar1 == XVar2);
    }
    testLSExceptions();
  }
LAB_0011af5f:
  plVar5 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  plVar7 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  uVar8 = (**(code **)(*plVar7 + 0x1e0))(plVar7);
  (**(code **)(*plVar4 + 0x50))(plVar4,plVar3,uVar8,2);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
  pXVar9 = (XMLCh *)(**(code **)(*plVar5 + 0x10))(plVar5);
  pXVar10 = tempStr2;
  if (pXVar9 != tempStr2) {
    if (pXVar9 == (XMLCh *)0x0) {
LAB_0011aff7:
      if (*pXVar10 == L'\0') goto LAB_0011b001;
    }
    else {
      pXVar10 = tempStr2;
      do {
        XVar1 = *pXVar9;
        if (XVar1 == L'\0') goto LAB_0011aff7;
        pXVar9 = pXVar9 + 1;
        XVar2 = *pXVar10;
        pXVar10 = pXVar10 + 1;
      } while (XVar1 == XVar2);
    }
    testLSExceptions();
  }
LAB_0011b001:
  plVar5 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  plVar7 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  uVar8 = (**(code **)(*plVar7 + 0x1e0))(plVar7);
  (**(code **)(*plVar4 + 0x50))(plVar4,plVar3,uVar8,3);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
  pXVar9 = (XMLCh *)(**(code **)(*plVar5 + 0x10))(plVar5);
  pXVar10 = tempStr2;
  if (pXVar9 != tempStr2) {
    if (pXVar9 == (XMLCh *)0x0) {
LAB_0011b08d:
      if (*pXVar10 == L'\0') goto LAB_0011b097;
    }
    else {
      pXVar10 = tempStr2;
      do {
        XVar1 = *pXVar9;
        if (XVar1 == L'\0') goto LAB_0011b08d;
        pXVar9 = pXVar9 + 1;
        XVar2 = *pXVar10;
        pXVar10 = pXVar10 + 1;
      } while (XVar1 == XVar2);
    }
    testLSExceptions();
  }
LAB_0011b097:
  plVar5 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  plVar7 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  uVar8 = (**(code **)(*plVar7 + 0x1e0))(plVar7);
  (**(code **)(*plVar4 + 0x50))(plVar4,plVar3,uVar8,4);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1f8))(plVar5);
  pXVar9 = (XMLCh *)(**(code **)(*plVar5 + 0x10))(plVar5);
  pXVar10 = tempStr2;
  if (pXVar9 != tempStr2) {
    if (pXVar9 == (XMLCh *)0x0) {
LAB_0011b12f:
      if (*pXVar10 == L'\0') goto LAB_0011b139;
    }
    else {
      pXVar10 = tempStr2;
      do {
        XVar1 = *pXVar9;
        if (XVar1 == L'\0') goto LAB_0011b12f;
        pXVar9 = pXVar9 + 1;
        XVar2 = *pXVar10;
        pXVar10 = pXVar10 + 1;
      } while (XVar1 == XVar2);
    }
    testLSExceptions();
  }
LAB_0011b139:
  plVar5 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  plVar7 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  uVar8 = (**(code **)(*plVar7 + 0x1e0))(plVar7);
  (**(code **)(*plVar4 + 0x50))(plVar4,plVar3,uVar8,5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
  pXVar9 = (XMLCh *)(**(code **)(*plVar5 + 0x10))(plVar5);
  pXVar10 = tempStr2;
  if (pXVar9 != tempStr2) {
    if (pXVar9 == (XMLCh *)0x0) {
LAB_0011b1c5:
      if (*pXVar10 == L'\0') goto LAB_0011b1cf;
    }
    else {
      pXVar10 = tempStr2;
      do {
        XVar1 = *pXVar9;
        if (XVar1 == L'\0') goto LAB_0011b1c5;
        pXVar9 = pXVar9 + 1;
        XVar2 = *pXVar10;
        pXVar10 = pXVar10 + 1;
      } while (XVar1 == XVar2);
    }
    testLSExceptions();
  }
LAB_0011b1cf:
  plVar5 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,plVar3);
  xercesc_4_0::XMLString::transcode
            ("<x:root/>",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar3 + 0x40))(plVar3,tempStr2);
  plVar7 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  uVar8 = (**(code **)(*plVar7 + 0x1e0))(plVar7);
  (**(code **)(*plVar4 + 0x50))(plVar4,plVar3,uVar8,1);
  pXVar10 = tempStr2;
  xercesc_4_0::XMLString::transcode
            ("urn:xxx",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
  pXVar9 = (XMLCh *)(**(code **)(*plVar5 + 0xb0))(plVar5);
  if (pXVar9 != tempStr2) {
    if (pXVar9 == (XMLCh *)0x0) {
LAB_0011b2b1:
      if (*pXVar10 == L'\0') goto LAB_0011b2b9;
    }
    else {
      pXVar10 = tempStr2;
      do {
        XVar1 = *pXVar9;
        if (XVar1 == L'\0') goto LAB_0011b2b1;
        pXVar9 = pXVar9 + 1;
        XVar2 = *pXVar10;
        pXVar10 = pXVar10 + 1;
      } while (XVar1 == XVar2);
    }
    testLSExceptions();
  }
LAB_0011b2b9:
  (**(code **)(*plVar3 + 0x80))(plVar3);
  (**(code **)(*plVar4 + 0x60))(plVar4);
  return false;
}

Assistant:

bool DOMTest::testLSExceptions() {
    bool OK = true;

	const char* sXml="<?xml version='1.0'?>"
				"<!DOCTYPE root["
                "<!ENTITY ent1 'Dallas. &ent3; #5668'>"
                "<!ENTITY ent2 '1900 Dallas Road<![CDATA[ (East) ]]>'>"
                "<!ENTITY ent3 'California. &ent4; PO'>  "
                "<!ENTITY ent4 'USA '>"
                "<!ENTITY ent5 'The Content &ent6; never reached'>"
                "<!ENTITY ent6 'ends here. <foo/>'>"
                "]>"
                "<root>&ent1; &ent2;"
                  "<elem>Home </elem>"
                  "<elem>Test: &ent5;</elem>"
                "</root>";

    static const XMLCh gLS[] = { chLatin_L, chLatin_S, chNull };
    DOMImplementationLS *impl = (DOMImplementationLS*)DOMImplementationRegistry::getDOMImplementation(gLS);
    DOMLSParser       *domBuilder = impl->createLSParser(DOMImplementationLS::MODE_SYNCHRONOUS, 0);
    DOMLSInput        *input = impl->createLSInput();
    XMLString::transcode(sXml, tempStr, 3999);
    input->setStringData(tempStr);
    try
    {
        ParserAborter aborter;
        domBuilder->setFilter(&aborter);
        domBuilder->parse(input);

        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }
    catch(DOMLSException& e)
    {
        if(e.code!=DOMLSException::PARSE_ERR)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }

    try
    {
        ParserNester nester(domBuilder, input);
        domBuilder->setFilter(&nester);
        domBuilder->parse(input);

        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }
    catch(DOMException& e)
    {
        if(e.code!=DOMException::INVALID_STATE_ERR)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }

    try
    {
        ParserSkipper skipper;
        domBuilder->setFilter(&skipper);
        domBuilder->getDomConfig()->setParameter(XMLUni::fgDOMEntities, false);
        DOMDocument* doc=domBuilder->parse(input);

        // verify that we get only 3 calls: for the text node, the CDATA section and the root element
        if(doc==NULL || doc->getDocumentElement()==NULL || doc->getDocumentElement()->getChildElementCount()!=0 || skipper.fCallbackCalls!=3)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }
    catch(DOMException&)
    {
        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }

    // this XML should trigger reuse of DOMElement
	const char* sXml2="<?xml version='1.0'?>"
                "<root xmlns:x='urn:yyy'>"
                  "<elem xmlns:x='urn:xxx'>Home</elem>"
                  "<elem2>Test</elem2>"
                  "<elem>Home</elem>"
                  "<elem2>Test</elem2>"
                "</root>";
    XMLString::transcode(sXml2, tempStr, 3999);
    input->setStringData(tempStr);
    try
    {
        ParserSkipper skipper;
        domBuilder->setFilter(&skipper);
        DOMDocument* doc=domBuilder->parse(input);

        // verify that we get only 5 calls: for the root element, the two elem2 and the two text nodes under them
        if(doc==NULL || doc->getDocumentElement()==NULL || doc->getDocumentElement()->getChildElementCount()!=2 || skipper.fCallbackCalls!=5)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }
    catch(DOMException&)
    {
        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }

    // test for parseWithContext
    try
    {
        XMLString::transcode("root", tempStr2, 3999);
        domBuilder->setFilter(NULL);
        DOMDocument* doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_APPEND_AS_CHILDREN);
        // the first 'elem' child of 'root' must have a 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_REPLACE_CHILDREN);
        // the first 'elem' child of 'root' must have a 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_INSERT_BEFORE);
        // the first child of 'root' must be another 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_INSERT_AFTER);
        // the node after the first child of 'root' must be another 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getNextElementSibling()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_REPLACE);
        // the first child of 'root' must be another 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        // verify that namespaces are in scope
        doc=domBuilder->parse(input);
	    const char* sXml3="<x:root/>";
        XMLString::transcode(sXml3, tempStr2, 3999);
        input->setStringData(tempStr2);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_APPEND_AS_CHILDREN);
        // the first 'elem' child of 'root' must have a 'x:root' child
        XMLString::transcode("urn:xxx", tempStr2, 3999);
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getFirstElementChild()->getNamespaceURI(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }
    catch(DOMException&)
    {
        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }

    input->release();
    domBuilder->release();

    return OK;
}